

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_crop.c
# Opt level: O0

gdImagePtr gdImageCropAuto(gdImagePtr im,uint mode)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 local_44 [8];
  gdRect crop;
  int match;
  int color;
  int y;
  int x;
  int height;
  int width;
  uint mode_local;
  gdImagePtr im_local;
  
  iVar1 = im->sx;
  iVar4 = im->sy;
  local_44._0_4_ = 0;
  local_44._4_4_ = 0;
  crop.x = 0;
  crop.y = 0;
  switch(mode) {
  case 0:
  default:
    crop.height = im->transparent;
    break;
  case 1:
    crop.height = im->transparent;
    break;
  case 2:
    crop.height = gdImageColorClosestAlpha(im,0,0,0,0);
    break;
  case 3:
    crop.height = gdImageColorClosestAlpha(im,0xff,0xff,0xff,0);
    break;
  case 4:
    gdGuessBackgroundColorFromCorners(im,&crop.height);
  }
  crop.width = 1;
  for (match = 0; crop.width != 0 && match < iVar4; match = match + 1) {
    color = 0;
    while (iVar3 = crop.height, crop.width != 0 && color < iVar1) {
      iVar2 = gdImageGetPixel(im,color,match);
      color = color + 1;
      crop.width = (int)(iVar3 == iVar2);
    }
  }
  if (match == iVar4 + -1) {
    im_local = (gdImagePtr)0x0;
  }
  else {
    local_44._4_4_ = match + -1;
    crop.width = 1;
    match = iVar4;
    while (match = match + -1, crop.width != 0 && -1 < match) {
      color = 0;
      while (iVar3 = crop.height, crop.width != 0 && color < iVar1) {
        iVar2 = gdImageGetPixel(im,color,match);
        color = color + 1;
        crop.width = (int)(iVar3 == iVar2);
      }
    }
    if (match == 0) {
      crop.y = (iVar4 - local_44._4_4_) + 1;
    }
    else {
      crop.y = (match - local_44._4_4_) + 2;
    }
    crop.width = 1;
    for (color = 0; crop.width != 0 && color < iVar1; color = color + 1) {
      match = 0;
      while (iVar4 = crop.height, crop.width != 0 && match < local_44._4_4_ + crop.y + -1) {
        iVar3 = gdImageGetPixel(im,color,match);
        match = match + 1;
        crop.width = (int)(iVar4 == iVar3);
      }
    }
    local_44._0_4_ = color + -1;
    crop.width = 1;
    color = iVar1;
    while (color = color + -1, crop.width != 0 && -1 < color) {
      match = 0;
      while (iVar1 = crop.height, crop.width != 0 && match < local_44._4_4_ + crop.y + -1) {
        iVar4 = gdImageGetPixel(im,color,match);
        match = match + 1;
        crop.width = (int)(iVar1 == iVar4);
      }
    }
    crop.x = (color - local_44._0_4_) + 2;
    im_local = gdImageCrop(im,(gdRect *)local_44);
  }
  return im_local;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCropAuto(gdImagePtr im, const unsigned int mode)
{
	const int width = gdImageSX(im);
	const int height = gdImageSY(im);

	int x,y;
	int color, match;
	gdRect crop;

	crop.x = 0;
	crop.y = 0;
	crop.width = 0;
	crop.height = 0;

	switch (mode) {
	case GD_CROP_TRANSPARENT:
		color = gdImageGetTransparent(im);
		break;

	case GD_CROP_BLACK:
		color = gdImageColorClosestAlpha(im, 0, 0, 0, 0);
		break;

	case GD_CROP_WHITE:
		color = gdImageColorClosestAlpha(im, 255, 255, 255, 0);
		break;

	case GD_CROP_SIDES:
		gdGuessBackgroundColorFromCorners(im, &color);
		break;

	case GD_CROP_DEFAULT:
	default:
		color = gdImageGetTransparent(im);
		break;
	}

	/* TODO: Add gdImageGetRowPtr and works with ptr at the row level
	 * for the true color and palette images
	 * new formats will simply work with ptr
	 */
	match = 1;
	for (y = 0; match && y < height; y++) {
		for (x = 0; match && x < width; x++) {
			match = (color == gdImageGetPixel(im, x,y));
		}
	}

	/* Nothing to do > bye
	 * Duplicate the image?
	 */
	if (y == height - 1) {
		return NULL;
	}

	crop.y = y -1;
	match = 1;
	for (y = height - 1; match && y >= 0; y--) {
		for (x = 0; match && x < width; x++) {
			match = (color == gdImageGetPixel(im, x,y));
		}
	}

	if (y == 0) {
		crop.height = height - crop.y + 1;
	} else {
		crop.height = y - crop.y + 2;
	}

	match = 1;
	for (x = 0; match && x < width; x++) {
		for (y = 0; match && y < crop.y + crop.height - 1; y++) {
			match = (color == gdImageGetPixel(im, x,y));
		}
	}
	crop.x = x - 1;

	match = 1;
	for (x = width - 1; match && x >= 0; x--) {
		for (y = 0; match &&  y < crop.y + crop.height - 1; y++) {
			match = (color == gdImageGetPixel(im, x,y));
		}
	}
	crop.width = x - crop.x + 2;

	return gdImageCrop(im, &crop);
}